

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_types.h
# Opt level: O2

void __thiscall
Clasp::SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject>::reset
          (SingleOwnerPtr<Clasp::Enumerator,_Clasp::DeleteObject> *this,Enumerator *x)

{
  Enumerator *pEVar1;
  
  pEVar1 = (Enumerator *)(this->ptr_ & 0xfffffffffffffffe);
  if (((this->ptr_ & 1) != 0 && pEVar1 != x) &&
     (this->ptr_ = (uintp)pEVar1, pEVar1 != (Enumerator *)0x0)) {
    (*pEVar1->_vptr_Enumerator[1])();
  }
  this->ptr_ = (ulong)x | 1;
  return;
}

Assistant:

void reset(T* x)             {
		if (x != get() && is_owner()) { D deleter; deleter(release()); }
		ptr_ = set_bit(uintp(x),0);
	}